

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

void __thiscall DomActionGroup::~DomActionGroup(DomActionGroup *this)

{
  QList<DomAction_*> *this_00;
  QList<DomActionGroup_*> *this_01;
  QList<DomProperty_*> *this_02;
  const_iterator begin;
  const_iterator begin_00;
  const_iterator cVar1;
  Data *pDVar2;
  Data *pDVar3;
  Data *pDVar4;
  Data *pDVar5;
  
  this_00 = &this->m_action;
  begin.i = (this->m_action).d.ptr;
  qDeleteAll<QList<DomAction*>::const_iterator>
            (begin,(const_iterator)(begin.i + (this->m_action).d.size));
  QList<DomAction_*>::clear(this_00);
  this_01 = &this->m_actionGroup;
  begin_00.i = (this->m_actionGroup).d.ptr;
  qDeleteAll<QList<DomActionGroup*>::const_iterator>
            (begin_00,(const_iterator)(begin_00.i + (this->m_actionGroup).d.size));
  QList<DomActionGroup_*>::clear(this_01);
  this_02 = &this->m_property;
  cVar1.i = (this->m_property).d.ptr;
  qDeleteAll<QList<DomProperty*>::const_iterator>
            (cVar1,(const_iterator)(cVar1.i + (this->m_property).d.size));
  QList<DomProperty_*>::clear(this_02);
  cVar1.i = (this->m_attribute).d.ptr;
  qDeleteAll<QList<DomProperty*>::const_iterator>
            (cVar1,(const_iterator)(cVar1.i + (this->m_attribute).d.size));
  QList<DomProperty_*>::clear(&this->m_attribute);
  pDVar2 = (this->m_attribute).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_attribute).d.d)->super_QArrayData,8,0x10);
    }
  }
  pDVar2 = (this_02->d).d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this_02->d).d)->super_QArrayData,8,0x10);
    }
  }
  pDVar3 = (this_01->d).d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this_01->d).d)->super_QArrayData,8,0x10);
    }
  }
  pDVar4 = (this_00->d).d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this_00->d).d)->super_QArrayData,8,0x10);
    }
  }
  pDVar5 = (this->m_attr_name).d.d;
  if (pDVar5 != (Data *)0x0) {
    LOCK();
    (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)(pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
      QArrayData::deallocate(&((this->m_attr_name).d.d)->super_QArrayData,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

DomActionGroup::~DomActionGroup()
{
    qDeleteAll(m_action);
    m_action.clear();
    qDeleteAll(m_actionGroup);
    m_actionGroup.clear();
    qDeleteAll(m_property);
    m_property.clear();
    qDeleteAll(m_attribute);
    m_attribute.clear();
}